

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int BUFFER_prepend(BUFFER_HANDLE handle1,BUFFER_HANDLE handle2)

{
  uchar *__src;
  uchar *__src_00;
  ulong __n;
  ulong __n_00;
  uchar *__dest;
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  size_t __size;
  char *pcVar4;
  BUFFER *b1;
  BUFFER *b2;
  
  iVar3 = 0x213;
  if (((handle1 != handle2) && (handle1 != (BUFFER_HANDLE)0x0)) && (handle2 != (BUFFER_HANDLE)0x0))
  {
    __src = handle1->buffer;
    if (__src == (uchar *)0x0) {
      iVar3 = 0x21c;
    }
    else {
      __src_00 = handle2->buffer;
      if (__src_00 == (uchar *)0x0) {
        iVar3 = 0x221;
      }
      else {
        __n = handle1->size;
        __n_00 = handle2->size;
        __size = 0xffffffffffffffff;
        if (!CARRY8(__n_00,__n)) {
          __size = __n_00 + __n;
        }
        iVar3 = 0;
        if (__n_00 != 0) {
          if (__size == 0xffffffffffffffff) {
            p_Var1 = xlogging_get_log_function();
            iVar3 = 0x22f;
            if (p_Var1 == (LOGGER_LOG)0x0) {
              return 0x22f;
            }
            pcVar4 = "Failure: size_t overflow.";
            iVar2 = 0x22e;
          }
          else {
            __dest = (uchar *)malloc(__size);
            if (__dest != (uchar *)0x0) {
              memcpy(__dest,__src_00,__n_00);
              memcpy(__dest + __n_00,__src,__n);
              free(__src);
              handle1->buffer = __dest;
              handle1->size = handle1->size + handle2->size;
              return 0;
            }
            p_Var1 = xlogging_get_log_function();
            iVar3 = 0x239;
            if (p_Var1 == (LOGGER_LOG)0x0) {
              return 0x239;
            }
            pcVar4 = "Failure: allocating temp buffer.";
            iVar2 = 0x238;
          }
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/buffer.c"
                    ,"BUFFER_prepend",iVar2,1,pcVar4);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int BUFFER_prepend(BUFFER_HANDLE handle1, BUFFER_HANDLE handle2)
{
    int result;
    if ((handle1 == NULL) || (handle2 == NULL) || (handle1 == handle2))
    {
        /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b1 = (BUFFER*)handle1;
        BUFFER* b2 = (BUFFER*)handle2;
        if (b1->buffer == NULL)
        {
            /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
            result = MU_FAILURE;
        }
        else if (b2->buffer == NULL)
        {
            /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
            result = MU_FAILURE;
        }
        else
        {
            //put b2 ahead of b1: [b2][b1], return b1
            size_t malloc_size = safe_add_size_t(b1->size, b2->size);
            if (b2->size == 0)
            {
                // do nothing
                result = 0;
            }
            else if (malloc_size == SIZE_MAX)
            {
                LogError("Failure: size_t overflow.");
                result = MU_FAILURE;
            }
            else
            {
                // b2->size != 0
                unsigned char* temp = (unsigned char*)malloc(malloc_size);
                if (temp == NULL)
                {
                    /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
                    LogError("Failure: allocating temp buffer.");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_BUFFER_01_004: [ BUFFER_prepend concatenates handle1 onto handle2 without modifying handle1 and shall return zero on success. ]*/
                    // Append the BUFFER
#ifdef _MSC_VER
#pragma warning(disable:6386) // Buffer overrun while writing to 'temp'
#endif
                    (void)memcpy(temp, b2->buffer, b2->size);
                    // start from b1->size to append b1
                    (void)memcpy(&temp[b2->size], b1->buffer, b1->size);
#ifdef _MSC_VER
#pragma warning (default:6386)
#endif
                    free(b1->buffer);
                    b1->buffer = temp;
                    b1->size += b2->size;
                    result = 0;
                }
            }
        }
    }
    return result;
}